

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O0

void AddWeighedStatFreqs(SymbolStats *stats1,double w1,SymbolStats *stats2,double w2,
                        SymbolStats *result)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t i;
  SymbolStats *result_local;
  double w2_local;
  SymbolStats *stats2_local;
  double w1_local;
  SymbolStats *stats1_local;
  
  for (i = 0; i < 0x120; i = i + 1) {
    sVar1 = stats1->litlens[i];
    auVar5._8_4_ = (int)(sVar1 >> 0x20);
    auVar5._0_8_ = sVar1;
    auVar5._12_4_ = 0x45300000;
    sVar2 = stats2->litlens[i];
    auVar7._8_4_ = (int)(sVar2 >> 0x20);
    auVar7._0_8_ = sVar2;
    auVar7._12_4_ = 0x45300000;
    dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * w1 +
            ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * w2;
    uVar3 = (ulong)dVar4;
    result->litlens[i] = uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
  }
  for (i = 0; i < 0x20; i = i + 1) {
    sVar1 = stats1->dists[i];
    auVar6._8_4_ = (int)(sVar1 >> 0x20);
    auVar6._0_8_ = sVar1;
    auVar6._12_4_ = 0x45300000;
    sVar2 = stats2->dists[i];
    auVar8._8_4_ = (int)(sVar2 >> 0x20);
    auVar8._0_8_ = sVar2;
    auVar8._12_4_ = 0x45300000;
    dVar4 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * w1 +
            ((auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * w2;
    uVar3 = (ulong)dVar4;
    result->dists[i] = uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
  }
  result->litlens[0x100] = 1;
  return;
}

Assistant:

static void AddWeighedStatFreqs(const SymbolStats* stats1, double w1,
                                const SymbolStats* stats2, double w2,
                                SymbolStats* result) {
  size_t i;
  for (i = 0; i < ZOPFLI_NUM_LL; i++) {
    result->litlens[i] =
        (size_t) (stats1->litlens[i] * w1 + stats2->litlens[i] * w2);
  }
  for (i = 0; i < ZOPFLI_NUM_D; i++) {
    result->dists[i] =
        (size_t) (stats1->dists[i] * w1 + stats2->dists[i] * w2);
  }
  result->litlens[256] = 1;  /* End symbol. */
}